

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O3

bool DynamicProfileStorage::ExportFile(char16 *filename)

{
  char16 *str;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  char16_t **ppcVar5;
  StorageInfo *this;
  char *buffer;
  char *t;
  uint index;
  undefined1 auStack_58 [8];
  DynamicProfileStorageReaderWriter writer;
  DWORD recordSize;
  DWORD recordCount;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x259,"(enabled)","enabled");
    if (!bVar2) goto LAB_0096c29b;
    *puVar4 = 0;
  }
  if (((useCacheDir == true) && (bVar2 = AcquireLock(), bVar2)) &&
     (bVar2 = LoadCacheCatalog(), !bVar2)) {
    ReleaseLock();
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x260,"(0)","0");
    if (bVar2) {
      *puVar4 = 0;
      return false;
    }
LAB_0096c29b:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  auStack_58 = (undefined1  [8])0x0;
  writer.filename = (char16 *)0x0;
  bVar2 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)auStack_58,filename,L"wcb",true,
                     (errno_t *)0x0);
  if (bVar2) {
    writer._20_4_ = infoMap.count - infoMap.freeCount;
    bVar2 = DynamicProfileStorageReaderWriter::WriteArray<unsigned_int_const>
                      ((DynamicProfileStorageReaderWriter *)auStack_58,&MagicNumber,1);
    if (((bVar2) &&
        (bVar2 = DynamicProfileStorageReaderWriter::WriteArray<unsigned_int_const>
                           ((DynamicProfileStorageReaderWriter *)auStack_58,&FileFormatVersion,1),
        bVar2)) &&
       (bVar2 = DynamicProfileStorageReaderWriter::WriteArray<unsigned_int_const>
                          ((DynamicProfileStorageReaderWriter *)auStack_58,
                           (uint *)&writer.field_0x14,1), bVar2)) {
      if (writer._20_4_ != 0) {
        index = 0;
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          ppcVar5 = JsUtil::
                    BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                    ::GetKeyAt(&infoMap,index);
          str = *ppcVar5;
          if (str != (char16 *)0x0) {
            this = JsUtil::
                   BaseDictionary<const_char16_t_*,_DynamicProfileStorage::StorageInfo,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetValueAt(&infoMap,index);
            if (this->isFileStorage == true) {
              if (useCacheDir == false) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar4 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                   ,0x283,"(useCacheDir)","useCacheDir");
                if (!bVar2) goto LAB_0096c29b;
                *puVar4 = 0;
              }
              buffer = StorageInfo::ReadRecord(this);
              if (buffer != (char *)0x0) goto LAB_0096c066;
              ReleaseLock();
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar4 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                 ,0x288,"(0)","0");
            }
            else {
              if (useCacheDir != false) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar4 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                   ,0x28e,"(!useCacheDir)","!useCacheDir");
                if (!bVar2) goto LAB_0096c29b;
                *puVar4 = 0;
              }
              if (locked == true) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar4 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                   ,0x28f,"(!locked)","!locked");
                if (!bVar2) goto LAB_0096c29b;
                *puVar4 = 0;
              }
              buffer = (this->field_1).record;
LAB_0096c066:
              writer._16_4_ = GetRecordSize(buffer);
              bVar3 = DynamicProfileStorageReaderWriter::WriteUtf8String
                                ((DynamicProfileStorageReaderWriter *)auStack_58,str);
              bVar2 = true;
              if ((bVar3) &&
                 (bVar3 = DynamicProfileStorageReaderWriter::WriteArray<unsigned_int_const>
                                    ((DynamicProfileStorageReaderWriter *)auStack_58,
                                     (uint *)&writer.deleteNonClosed,1), bVar3)) {
                t = GetRecordBuffer(buffer);
                bVar2 = DynamicProfileStorageReaderWriter::WriteArray<char_const>
                                  ((DynamicProfileStorageReaderWriter *)auStack_58,t,
                                   (ulong)(uint)writer._16_4_);
                bVar2 = !bVar2;
              }
              if (useCacheDir == true) {
                DeleteRecord(buffer);
              }
              if (!bVar2) goto LAB_0096c0cf;
              if (useCacheDir == true) {
                ReleaseLock();
              }
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar4 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                 ,0x2a2,"(0)","0");
            }
            if (bVar2 == false) goto LAB_0096c29b;
            *puVar4 = 0;
            goto LAB_0096c18c;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                             ,0x27a,"(false)","false");
          if (!bVar2) goto LAB_0096c29b;
          *puVar4 = 0;
LAB_0096c0cf:
          index = index + 1;
        } while (index < (uint)writer._20_4_);
      }
      DynamicProfileStorageReaderWriter::Close
                ((DynamicProfileStorageReaderWriter *)auStack_58,false);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,DynamicProfileStoragePhase);
      bVar2 = true;
      if (bVar3) {
        Output::Print(L"TRACE: DynamicProfileStorage: Exported file: \'%s\'\n",filename);
        Output::Flush();
      }
      goto LAB_0096c18f;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x272,"(0)","0");
    if (!bVar2) goto LAB_0096c29b;
    *puVar4 = 0;
  }
  else {
    Output::Print(L"ERROR: DynamicProfileStorage: Unable to open file \'%s\' to export\n",filename);
    Output::Flush();
  }
LAB_0096c18c:
  bVar2 = false;
LAB_0096c18f:
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)auStack_58);
  return bVar2;
}

Assistant:

bool DynamicProfileStorage::ExportFile(__in_z char16 const * filename)
{
    AssertOrFailFast(enabled);

    if (useCacheDir && AcquireLock())
    {
        if (!LoadCacheCatalog()) // refresh the cache catalog
        {
            ReleaseLock();
            AssertOrFailFast(FALSE);
            return false;
        }
    }

    DynamicProfileStorageReaderWriter writer;

    if (!writer.Init(filename, _u("wcb"), true))
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Unable to open file '%s' to export\n"), filename);
        Output::Flush();
        return false;
    }
    DWORD recordCount = infoMap.Count();
    if (!writer.Write(MagicNumber)
        || !writer.Write(FileFormatVersion)
        || !writer.Write(recordCount))
    {
        AssertOrFailFast(FALSE);
        return false;
    }
    for (uint i = 0; i < recordCount; i++)
    {
        char16 const * url = infoMap.GetKeyAt(i);
        if (url == nullptr)
        {
            AssertOrFailFast(false);
            continue;
        }

        StorageInfo const& info = infoMap.GetValueAt(i);

        char const * record;
        if (info.isFileStorage)
        {
            AssertOrFailFast(useCacheDir);
            record = info.ReadRecord();
            if (record == nullptr)
            {
                ReleaseLock();
                AssertOrFailFast(FALSE);
                return false;
            }
        }
        else
        {
            AssertOrFailFast(!useCacheDir);
            AssertOrFailFast(!locked);
            record = info.record;
        }
        DWORD recordSize = GetRecordSize(record);

        bool failed = (!writer.WriteUtf8String(url)
            || !writer.Write(recordSize)
            || !writer.WriteArray(GetRecordBuffer(record), recordSize));

        if (useCacheDir)
        {
            DeleteRecord(record);
        }
        if (failed)
        {
            if (useCacheDir)
            {
                ReleaseLock();
            }
            AssertOrFailFast(FALSE);
            return false;
        }
    }
    writer.Close();
#if DBG_DUMP
    if (DynamicProfileStorage::DoTrace())
    {
        Output::Print(_u("TRACE: DynamicProfileStorage: Exported file: '%s'\n"), filename);
        Output::Flush();
    }
#endif
    return true;
}